

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compressCTable_internal
                 (BYTE *ostart,BYTE *op,BYTE *oend,void *src,size_t srcSize,
                 HUF_nbStreams_e nbStreams,HUF_CElt *CTable,int bmi2)

{
  uint uVar1;
  BYTE *local_50;
  size_t cSize;
  HUF_nbStreams_e nbStreams_local;
  size_t srcSize_local;
  void *src_local;
  BYTE *oend_local;
  BYTE *op_local;
  BYTE *ostart_local;
  
  if (nbStreams == HUF_singleStream) {
    local_50 = (BYTE *)HUF_compress1X_usingCTable_internal
                                 (op,(long)oend - (long)op,src,srcSize,CTable,bmi2);
  }
  else {
    local_50 = (BYTE *)HUF_compress4X_usingCTable_internal
                                 (op,(long)oend - (long)op,src,srcSize,CTable,bmi2);
  }
  uVar1 = ERR_isError((size_t)local_50);
  if (uVar1 == 0) {
    if (local_50 == (BYTE *)0x0) {
      ostart_local = (BYTE *)0x0;
    }
    else if ((ulong)((long)(local_50 + (long)op) - (long)ostart) < srcSize - 1) {
      ostart_local = local_50 + (long)op + -(long)ostart;
    }
    else {
      ostart_local = (BYTE *)0x0;
    }
  }
  else {
    ostart_local = local_50;
  }
  return (size_t)ostart_local;
}

Assistant:

static size_t HUF_compressCTable_internal(
                BYTE* const ostart, BYTE* op, BYTE* const oend,
                const void* src, size_t srcSize,
                HUF_nbStreams_e nbStreams, const HUF_CElt* CTable, const int bmi2)
{
    size_t const cSize = (nbStreams==HUF_singleStream) ?
                         HUF_compress1X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, bmi2) :
                         HUF_compress4X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, bmi2);
    if (HUF_isError(cSize)) { return cSize; }
    if (cSize==0) { return 0; }   /* uncompressible */
    op += cSize;
    /* check compressibility */
    assert(op >= ostart);
    if ((size_t)(op-ostart) >= srcSize-1) { return 0; }
    return (size_t)(op-ostart);
}